

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

void u_enumCharNames_63(UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,void *context,
                       UCharNameChoice nameChoice,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint limit_00;
  uint uVar2;
  int iVar3;
  AlgorithmicRange *range;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (fn == (UEnumCharNamesFn *)0x0 || 3 < (int)nameChoice) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      limit_00 = 0x110000;
      if ((uint)limit < 0x110000) {
        limit_00 = limit;
      }
      if (((uint)start < limit_00) && (UVar1 = icu_63::isDataLoaded(pErrorCode), UVar1 != '\0')) {
        iVar3 = *(int *)((long)&icu_63::uCharNames->tokenStringOffset +
                        (ulong)icu_63::uCharNames->algNamesOffset);
        if (iVar3 != 0) {
          range = (AlgorithmicRange *)
                  ((long)&icu_63::uCharNames->groupsOffset +
                  (ulong)icu_63::uCharNames->algNamesOffset);
          do {
            uVar2 = range->start;
            if ((uint)start < uVar2) {
              if (limit_00 <= uVar2) break;
              UVar1 = icu_63::enumNames(icu_63::uCharNames,start,uVar2,fn,context,nameChoice);
              if (UVar1 == '\0') {
                return;
              }
              start = range->start;
            }
            if ((uint)start <= range->end) {
              uVar2 = range->end + 1;
              if (limit_00 <= uVar2) {
                icu_63::enumAlgNames(range,start,limit_00,fn,context,nameChoice);
                return;
              }
              UVar1 = icu_63::enumAlgNames(range,start,uVar2,fn,context,nameChoice);
              if (UVar1 == '\0') {
                return;
              }
              start = range->end + 1;
            }
            range = (AlgorithmicRange *)((long)&range->start + (ulong)range->size);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        icu_63::enumNames(icu_63::uCharNames,start,limit_00,fn,context,nameChoice);
        return;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_enumCharNames(UChar32 start, UChar32 limit,
                UEnumCharNamesFn *fn,
                void *context,
                UCharNameChoice nameChoice,
                UErrorCode *pErrorCode) {
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || fn==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if((uint32_t) limit > UCHAR_MAX_VALUE + 1) {
        limit = UCHAR_MAX_VALUE + 1;
    }
    if((uint32_t)start>=(uint32_t)limit) {
        return;
    }

    if(!isDataLoaded(pErrorCode)) {
        return;
    }

    /* interleave the data-driven ones with the algorithmic ones */
    /* iterate over all algorithmic ranges; assume that they are in ascending order */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        /* enumerate the character names before the current algorithmic range */
        /* here: start<limit */
        if((uint32_t)start<algRange->start) {
            if((uint32_t)limit<=algRange->start) {
                enumNames(uCharNames, start, limit, fn, context, nameChoice);
                return;
            }
            if(!enumNames(uCharNames, start, (UChar32)algRange->start, fn, context, nameChoice)) {
                return;
            }
            start=(UChar32)algRange->start;
        }
        /* enumerate the character names in the current algorithmic range */
        /* here: algRange->start<=start<limit */
        if((uint32_t)start<=algRange->end) {
            if((uint32_t)limit<=(algRange->end+1)) {
                enumAlgNames(algRange, start, limit, fn, context, nameChoice);
                return;
            }
            if(!enumAlgNames(algRange, start, (UChar32)algRange->end+1, fn, context, nameChoice)) {
                return;
            }
            start=(UChar32)algRange->end+1;
        }
        /* continue to the next algorithmic range (here: start<limit) */
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }
    /* enumerate the character names after the last algorithmic range */
    enumNames(uCharNames, start, limit, fn, context, nameChoice);
}